

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

void envy_bios_print_power_sense(envy_bios *bios,FILE *out,uint mask)

{
  byte bVar1;
  uint uVar2;
  envy_bios_power_sense_entry *peVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar2 = (bios->power).sense.offset;
  if ((mask >> 10 & 1) == 0 || uVar2 == 0) {
    return;
  }
  uVar5 = (ulong)(bios->power).sense.version;
  if ((bios->power).sense.valid != '\0') {
    fprintf((FILE *)out,"SENSE table at 0x%x, version %x\n",(ulong)uVar2,uVar5);
    envy_bios_dump_hex(bios,out,(bios->power).sense.offset,(uint)(bios->power).sense.hlen,mask);
    if ((int)mask < 0) {
      fputc(10,(FILE *)out);
    }
    if ((bios->power).sense.entriesnum != '\0') {
      lVar6 = 0;
      uVar5 = 0;
      do {
        peVar3 = (bios->power).sense.entries;
        uVar4 = (ulong)(&peVar3->extdev_id)[lVar6];
        if ((&peVar3->extdev_id)[lVar6] < (bios->extdev).entriesnum) {
          bVar1 = (bios->extdev).entries[uVar4].type;
          if (bVar1 - 0x4c < 2) {
            fprintf((FILE *)out,
                    "power rail %i: unk0 = 0x%x, extdev_id = %u, shunt resistor = %u mOhm (unk %x), config = 0x%04x\n"
                    ,uVar5 & 0xffffffff,(ulong)(&peVar3->mode)[lVar6],uVar4,
                    (ulong)(peVar3->d).raw[lVar6],(ulong)(peVar3->d).raw[lVar6 + 1],
                    (ulong)*(ushort *)((long)&peVar3->d + lVar6 + 2));
          }
          else if (bVar1 == 0x4e) {
            fprintf((FILE *)out,
                    "power rail %i: unk0 = 0x%x, extdev_id = %u, shunt resistors = {%u mOhm (unk %x), %u mOhm (unk %x), %u mOhm (unk %x)}, config = 0x%04x\n"
                    ,uVar5 & 0xffffffff,(ulong)(&peVar3->mode)[lVar6],uVar4,
                    (ulong)(peVar3->d).raw[lVar6],(ulong)(peVar3->d).raw[lVar6 + 1],
                    (ulong)(peVar3->d).raw[lVar6 + 2],(ulong)(peVar3->d).raw[lVar6 + 3],
                    (ulong)(peVar3->d).raw[lVar6 + 4],(ulong)(peVar3->d).raw[lVar6 + 5],
                    (ulong)*(ushort *)((long)&peVar3->d + lVar6 + 6));
          }
          else {
            fprintf((FILE *)out,"power rail %i: unk0 = 0x%x, extdev_id = %u\n",uVar5 & 0xffffffff,
                    (ulong)(&peVar3->mode)[lVar6]);
          }
        }
        envy_bios_dump_hex(bios,out,*(uint *)((long)&((bios->power).sense.entries)->offset + lVar6),
                           (uint)(bios->power).sense.rlen,mask);
        if ((int)mask < 0) {
          fputc(10,(FILE *)out);
        }
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x18;
      } while (uVar5 < (bios->power).sense.entriesnum);
    }
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse SENSE table at 0x%x, version %x\n",(ulong)uVar2,uVar5);
  return;
}

Assistant:

void envy_bios_print_power_sense(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_sense *sense = &bios->power.sense;
	int i;

	if (!sense->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!sense->valid) {
		fprintf(out, "Failed to parse SENSE table at 0x%x, version %x\n", sense->offset, sense->version);
		return;
	}

	fprintf(out, "SENSE table at 0x%x, version %x\n", sense->offset, sense->version);
	envy_bios_dump_hex(bios, out, sense->offset, sense->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < sense->entriesnum; i++) {
		struct envy_bios_power_sense_entry *e = &sense->entries[i];

		if (bios->extdev.entriesnum > e->extdev_id) {
			switch (bios->extdev.entries[e->extdev_id].type) {
			case ENVY_BIOS_EXTDEV_INA209:
			case ENVY_BIOS_EXTDEV_INA219:
				fprintf(out, "power rail %i: unk0 = 0x%x, extdev_id = %u, shunt resistor = %u mOhm (unk %x), config = 0x%04x\n",
					i, e->mode, e->extdev_id, e->d.ina219.res.mohm, e->d.ina219.res.unk, e->d.ina219.config);
				break;
			case ENVY_BIOS_EXTDEV_INA3221:
				fprintf(out, "power rail %i: unk0 = 0x%x, extdev_id = %u, shunt resistors = {%u mOhm (unk %x), %u mOhm (unk %x), %u mOhm (unk %x)}, config = 0x%04x\n",
					i, e->mode, e->extdev_id, e->d.ina3221.res[0].mohm, e->d.ina3221.res[0].unk, e->d.ina3221.res[1].mohm, e->d.ina3221.res[1].unk, e->d.ina3221.res[2].mohm, e->d.ina3221.res[2].unk, e->d.ina3221.config);
				break;
			default:
				fprintf(out, "power rail %i: unk0 = 0x%x, extdev_id = %u\n",
					i, e->mode, e->extdev_id);
			}
		}
		envy_bios_dump_hex(bios, out, sense->entries[i].offset, sense->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}